

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tagger.cpp
# Opt level: O0

char * __thiscall MeCab::anon_unknown_0::TaggerImpl::formatNode(TaggerImpl *this,Node *node)

{
  int iVar1;
  Lattice *pLVar2;
  undefined4 extraout_var;
  undefined8 in_RSI;
  char *in_RDI;
  char *result;
  TaggerImpl *in_stack_ffffffffffffffe0;
  TaggerImpl *local_8;
  
  pLVar2 = mutable_lattice(in_stack_ffffffffffffffe0);
  iVar1 = (*pLVar2->_vptr_Lattice[0x19])(pLVar2,in_RSI);
  local_8 = (TaggerImpl *)CONCAT44(extraout_var,iVar1);
  if (local_8 == (TaggerImpl *)0x0) {
    pLVar2 = mutable_lattice((TaggerImpl *)0x0);
    (*pLVar2->_vptr_Lattice[0x24])();
    set_what(local_8,in_RDI);
    local_8 = (TaggerImpl *)0x0;
  }
  return (char *)local_8;
}

Assistant:

const char* TaggerImpl::formatNode(const Node* node) {
  const char *result = mutable_lattice()->toString(node);
  if (!result) {
    set_what(mutable_lattice()->what());
    return 0;
  }
  return result;
}